

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::FixedSizeUnpackedArrayType::getDefaultValueImpl
          (ConstantValue *__return_storage_ptr__,FixedSizeUnpackedArrayType *this)

{
  bitwidth_t bVar1;
  allocator<slang::ConstantValue> local_59;
  ConstantValue local_58;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> local_30;
  FixedSizeUnpackedArrayType *local_18;
  FixedSizeUnpackedArrayType *this_local;
  
  local_18 = this;
  this_local = (FixedSizeUnpackedArrayType *)__return_storage_ptr__;
  bVar1 = ConstantRange::width(&this->range);
  Type::getDefaultValue(&local_58,this->elementType);
  std::allocator<slang::ConstantValue>::allocator(&local_59);
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
            (&local_30,(ulong)bVar1,&local_58,&local_59);
  slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_30);
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector(&local_30);
  std::allocator<slang::ConstantValue>::~allocator(&local_59);
  slang::ConstantValue::~ConstantValue(&local_58);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue FixedSizeUnpackedArrayType::getDefaultValueImpl() const {
    return std::vector<ConstantValue>(range.width(), elementType.getDefaultValue());
}